

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_top_n.cpp
# Opt level: O1

void __thiscall
duckdb::PhysicalTopN::PhysicalTopN
          (PhysicalTopN *this,vector<duckdb::LogicalType,_true> *types,
          vector<duckdb::BoundOrderByNode,_true> *orders,idx_t limit,idx_t offset,
          shared_ptr<duckdb::DynamicFilterData,_true> *dynamic_filter_p,idx_t estimated_cardinality)

{
  pointer pLVar1;
  pointer pLVar2;
  pointer pLVar3;
  pointer pBVar4;
  element_type *peVar5;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var6;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_48;
  
  pLVar1 = (types->super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>).
           super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
           super__Vector_impl_data._M_start;
  pLVar2 = (types->super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>).
           super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
           super__Vector_impl_data._M_finish;
  pLVar3 = (types->super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>).
           super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
  (types->super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>).
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (types->super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>).
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (types->super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>).
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_PhysicalOperator)._vptr_PhysicalOperator =
       (_func_int **)&PTR__PhysicalOperator_024ab838;
  (this->super_PhysicalOperator).type = TOP_N;
  (this->super_PhysicalOperator).children.
  super_vector<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
  .
  super__Vector_base<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_PhysicalOperator).children.
  super_vector<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
  .
  super__Vector_base<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_PhysicalOperator).children.
  super_vector<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
  .
  super__Vector_base<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->super_PhysicalOperator).types.
  super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_start = pLVar1;
  (this->super_PhysicalOperator).types.
  super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_finish = pLVar2;
  (this->super_PhysicalOperator).types.
  super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = pLVar3;
  local_48.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_48.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_PhysicalOperator).estimated_cardinality = estimated_cardinality;
  (this->super_PhysicalOperator).sink_state.
  super_unique_ptr<duckdb::GlobalSinkState,_std::default_delete<duckdb::GlobalSinkState>_>._M_t.
  super___uniq_ptr_impl<duckdb::GlobalSinkState,_std::default_delete<duckdb::GlobalSinkState>_>._M_t
  .super__Tuple_impl<0UL,_duckdb::GlobalSinkState_*,_std::default_delete<duckdb::GlobalSinkState>_>.
  super__Head_base<0UL,_duckdb::GlobalSinkState_*,_false>._M_head_impl = (GlobalSinkState *)0x0;
  (this->super_PhysicalOperator).op_state.
  super_unique_ptr<duckdb::GlobalOperatorState,_std::default_delete<duckdb::GlobalOperatorState>_>.
  _M_t.
  super___uniq_ptr_impl<duckdb::GlobalOperatorState,_std::default_delete<duckdb::GlobalOperatorState>_>
  ._M_t.
  super__Tuple_impl<0UL,_duckdb::GlobalOperatorState_*,_std::default_delete<duckdb::GlobalOperatorState>_>
  .super__Head_base<0UL,_duckdb::GlobalOperatorState_*,_false>._M_head_impl =
       (GlobalOperatorState *)0x0;
  (this->super_PhysicalOperator).lock.super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->super_PhysicalOperator).lock.super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(this->super_PhysicalOperator).lock.super___mutex_base._M_mutex + 0x10) = 0
  ;
  (this->super_PhysicalOperator).lock.super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->super_PhysicalOperator).lock.super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_48);
  (this->super_PhysicalOperator)._vptr_PhysicalOperator = (_func_int **)&PTR__PhysicalTopN_024a7350;
  pBVar4 = (orders->
           super_vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>).
           super__Vector_base<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  (this->orders).super_vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>.
  super__Vector_base<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>._M_impl.
  super__Vector_impl_data._M_start =
       (orders->super_vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>).
       super__Vector_base<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>.
       _M_impl.super__Vector_impl_data._M_start;
  (this->orders).super_vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>.
  super__Vector_base<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>._M_impl.
  super__Vector_impl_data._M_finish = pBVar4;
  (this->orders).super_vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>.
  super__Vector_base<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (orders->super_vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>).
       super__Vector_base<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>.
       _M_impl.super__Vector_impl_data._M_end_of_storage;
  (orders->super_vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>).
  super__Vector_base<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (orders->super_vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>).
  super__Vector_base<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (orders->super_vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>).
  super__Vector_base<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  this->limit = limit;
  this->offset = offset;
  (this->dynamic_filter).internal.
  super___shared_ptr<duckdb::DynamicFilterData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  peVar5 = (dynamic_filter_p->internal).
           super___shared_ptr<duckdb::DynamicFilterData,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  p_Var6 = (dynamic_filter_p->internal).
           super___shared_ptr<duckdb::DynamicFilterData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi;
  (dynamic_filter_p->internal).
  super___shared_ptr<duckdb::DynamicFilterData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->dynamic_filter).internal.
  super___shared_ptr<duckdb::DynamicFilterData,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar5;
  (this->dynamic_filter).internal.
  super___shared_ptr<duckdb::DynamicFilterData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       p_Var6;
  (dynamic_filter_p->internal).
  super___shared_ptr<duckdb::DynamicFilterData,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  return;
}

Assistant:

PhysicalTopN::PhysicalTopN(vector<LogicalType> types, vector<BoundOrderByNode> orders, idx_t limit, idx_t offset,
                           shared_ptr<DynamicFilterData> dynamic_filter_p, idx_t estimated_cardinality)
    : PhysicalOperator(PhysicalOperatorType::TOP_N, std::move(types), estimated_cardinality), orders(std::move(orders)),
      limit(limit), offset(offset), dynamic_filter(std::move(dynamic_filter_p)) {
}